

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O2

int __thiscall
QSignalSpyPrivate::qt_metacall(QSignalSpyPrivate *this,Call call,int methodId,void **a)

{
  int iVar1;
  undefined4 in_register_00000014;
  
  iVar1 = QObject::qt_metacall((Call)this,call,(void **)CONCAT44(in_register_00000014,methodId));
  if (call == InvokeMetaMethod && -1 < iVar1) {
    if (iVar1 == 0) {
      QSignalSpy::appendArgs(this->q,a);
    }
    iVar1 = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

int QSignalSpyPrivate::qt_metacall(QMetaObject::Call call, int methodId, void **a)
{
    methodId = QObject::qt_metacall(call, methodId, a);
    if (methodId < 0)
        return methodId;

    if (call == QMetaObject::InvokeMetaMethod) {
        if (methodId == 0) {
            q->appendArgs(a);
        }
        --methodId;
    }
    return methodId;
}